

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall
tcu::operator-(tcu *this,Matrix<float,_2,_2> *a,Matrix<float,_2,_2> *b)

{
  float fVar1;
  float *pfVar2;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar3;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar4;
  undefined4 local_2c;
  undefined4 local_28;
  int row;
  int col;
  Matrix<float,_2,_2> *b_local;
  Matrix<float,_2,_2> *a_local;
  Matrix<float,_2,_2> *res;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar3.m_data = extraout_XMM0_Qa;
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pfVar2 = Matrix<float,_2,_2>::operator()(a,local_2c,local_28);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_2,_2>::operator()(b,local_2c,local_28);
      in_XMM1_Qa.m_data[1] = 0.0;
      in_XMM1_Qa.m_data[0] = *pfVar2;
      VVar3.m_data[0] = fVar1 - *pfVar2;
      pfVar2 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,local_2c,local_28);
      VVar3.m_data[1] = 0.0;
      *pfVar2 = VVar3.m_data[0];
    }
  }
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar4.m_data.m_data[0].m_data[0] = VVar3.m_data[0];
  MVar4.m_data.m_data[0].m_data[1] = VVar3.m_data[1];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

Matrix<T, Rows, Cols> operator- (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) - b(row, col);
	return res;
}